

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

cmTarget * __thiscall
cmMakefile::AddExecutable
          (cmMakefile *this,string *exeName,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *srcs,bool excludeFromAll)

{
  cmTarget *this_00;
  bool local_8a;
  allocator<char> local_89;
  string local_88;
  byte local_65;
  byte local_52;
  allocator<char> local_51;
  string local_50;
  cmTarget *local_30;
  cmTarget *target;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_20;
  bool excludeFromAll_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *srcs_local;
  string *exeName_local;
  cmMakefile *this_local;
  
  target._7_1_ = excludeFromAll;
  pvStack_20 = srcs;
  srcs_local = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)exeName;
  exeName_local = (string *)this;
  local_30 = AddNewTarget(this,EXECUTABLE,exeName);
  local_52 = 0;
  local_65 = 0;
  local_8a = true;
  if ((target._7_1_ & 1) == 0) {
    std::allocator<char>::allocator();
    local_52 = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"EXCLUDE_FROM_ALL",&local_51);
    local_65 = 1;
    local_8a = GetPropertyAsBool(this,&local_50);
  }
  if ((local_65 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_52 & 1) != 0) {
    std::allocator<char>::~allocator(&local_51);
  }
  this_00 = local_30;
  if (local_8a != false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"EXCLUDE_FROM_ALL",&local_89);
    cmTarget::SetProperty(this_00,&local_88,"TRUE");
    std::__cxx11::string::~string((string *)&local_88);
    std::allocator<char>::~allocator(&local_89);
  }
  cmTarget::AddSources(local_30,pvStack_20);
  AddGlobalLinkInformation(this,local_30);
  return local_30;
}

Assistant:

cmTarget* cmMakefile::AddExecutable(const std::string& exeName,
                                    const std::vector<std::string>& srcs,
                                    bool excludeFromAll)
{
  cmTarget* target = this->AddNewTarget(cmStateEnums::EXECUTABLE, exeName);
  if (excludeFromAll || this->GetPropertyAsBool("EXCLUDE_FROM_ALL")) {
    target->SetProperty("EXCLUDE_FROM_ALL", "TRUE");
  }
  target->AddSources(srcs);
  this->AddGlobalLinkInformation(*target);
  return target;
}